

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall wasm::ReFinalize::ReFinalize(ReFinalize *this)

{
  WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_0111eb60;
  (this->breakTypes)._M_h._M_buckets = &(this->breakTypes)._M_h._M_single_bucket;
  (this->breakTypes)._M_h._M_bucket_count = 1;
  (this->breakTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->breakTypes)._M_h._M_element_count = 0;
  (this->breakTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->breakTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->breakTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::assign
            ((char *)&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      ).super_Pass.name);
  return;
}

Assistant:

ReFinalize() { name = "refinalize"; }